

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeOverwriteContent(MemPage *pPage,u8 *pDest,BtreePayload *pX,int iOffset,int iAmt)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar1 = pX->nData;
  uVar4 = iVar1 - iOffset;
  if (uVar4 == 0 || iVar1 < iOffset) {
    iVar1 = 0;
    uVar3 = 0;
    if (0 < iAmt) {
      uVar3 = (ulong)(uint)iAmt;
    }
    for (uVar5 = 0; uVar3 != uVar5; uVar5 = uVar5 + 1) {
      if (pDest[uVar5] != '\0') {
        iVar1 = sqlite3PagerWrite(pPage->pDbPage);
        if (iVar1 != 0) {
          return iVar1;
        }
        memset(pDest + uVar5,0,(long)iAmt - uVar5);
        return 0;
      }
    }
  }
  else if ((iAmt - uVar4 == 0 || iAmt < (int)uVar4) ||
          (iVar1 = btreeOverwriteContent(pPage,pDest + uVar4,pX,iVar1,iAmt - uVar4), iAmt = uVar4,
          iVar1 == 0)) {
    iVar2 = bcmp(pDest,(void *)((long)pX->pData + (long)iOffset),(long)iAmt);
    iVar1 = 0;
    if ((iVar2 != 0) && (iVar1 = sqlite3PagerWrite(pPage->pDbPage), iVar1 == 0)) {
      memmove(pDest,(void *)((long)iOffset + (long)pX->pData),(long)iAmt);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int btreeOverwriteContent(
  MemPage *pPage,           /* MemPage on which writing will occur */
  u8 *pDest,                /* Pointer to the place to start writing */
  const BtreePayload *pX,   /* Source of data to write */
  int iOffset,              /* Offset of first byte to write */
  int iAmt                  /* Number of bytes to be written */
){
  int nData = pX->nData - iOffset;
  if( nData<=0 ){
    /* Overwriting with zeros */
    int i;
    for(i=0; i<iAmt && pDest[i]==0; i++){}
    if( i<iAmt ){
      int rc = sqlite3PagerWrite(pPage->pDbPage);
      if( rc ) return rc;
      memset(pDest + i, 0, iAmt - i);
    }
  }else{
    if( nData<iAmt ){
      /* Mixed read data and zeros at the end.  Make a recursive call
      ** to write the zeros then fall through to write the real data */
      int rc = btreeOverwriteContent(pPage, pDest+nData, pX, iOffset+nData,
                                 iAmt-nData);
      if( rc ) return rc;
      iAmt = nData;
    }
    if( memcmp(pDest, ((u8*)pX->pData) + iOffset, iAmt)!=0 ){
      int rc = sqlite3PagerWrite(pPage->pDbPage);
      if( rc ) return rc;
      /* In a corrupt database, it is possible for the source and destination
      ** buffers to overlap.  This is harmless since the database is already
      ** corrupt but it does cause valgrind and ASAN warnings.  So use
      ** memmove(). */
      memmove(pDest, ((u8*)pX->pData) + iOffset, iAmt);
    }
  }
  return SQLITE_OK;
}